

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wav.cpp
# Opt level: O0

void __thiscall
ASDCP::Wav::SimpleWaveHeader::FillADesc
          (SimpleWaveHeader *this,AudioDescriptor *ADesc,Rational PictureRate)

{
  ui32_t uVar1;
  Rational RStack_28;
  ui32_t FrameBufferSize;
  AudioDescriptor *local_20;
  AudioDescriptor *ADesc_local;
  SimpleWaveHeader *this_local;
  Rational PictureRate_local;
  
  ADesc->EditRate = PictureRate;
  ADesc->LinkedTrackID = 0;
  ADesc->Locked = 0;
  ADesc->ChannelCount = (uint)this->nchannels;
  local_20 = ADesc;
  ADesc_local = (AudioDescriptor *)this;
  this_local = (SimpleWaveHeader *)PictureRate;
  Rational::Rational(&stack0xffffffffffffffd8,this->samplespersec,1);
  local_20->AudioSamplingRate = RStack_28;
  local_20->AvgBps = this->avgbps;
  local_20->BlockAlign = (uint)this->blockalign;
  local_20->QuantizationBits = (uint)this->bitspersample;
  uVar1 = PCM::CalcFrameBufferSize(local_20);
  local_20->ContainerDuration = this->data_len / uVar1;
  local_20->ChannelFormat = CF_NONE;
  return;
}

Assistant:

void
ASDCP::Wav::SimpleWaveHeader::FillADesc(ASDCP::PCM::AudioDescriptor& ADesc, ASDCP::Rational PictureRate) const
{
  ADesc.EditRate = PictureRate;

  ADesc.LinkedTrackID = 0;
  ADesc.Locked = 0;
  ADesc.ChannelCount = nchannels;
  ADesc.AudioSamplingRate = Rational(samplespersec, 1);
  ADesc.AvgBps = avgbps;
  ADesc.BlockAlign = blockalign;
  ADesc.QuantizationBits = bitspersample;
  ui32_t FrameBufferSize = ASDCP::PCM::CalcFrameBufferSize(ADesc);
  ADesc.ContainerDuration = data_len / FrameBufferSize;
  ADesc.ChannelFormat = PCM::CF_NONE;
}